

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

bool __thiscall sf::Shader::loadFromStream(Shader *this,InputStream *stream,Type type)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> shader;
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = anon_unknown.dwarf_1f63b7::getStreamContents
                    (stream,(vector<char,_std::allocator<char>_> *)&local_28);
  if (bVar1) {
    if (type == Geometry) {
      bVar1 = compile(this,(char *)0x0,local_28._M_impl.super__Vector_impl_data._M_start,(char *)0x0
                     );
    }
    else if (type == Vertex) {
      bVar1 = compile(this,local_28._M_impl.super__Vector_impl_data._M_start,(char *)0x0,(char *)0x0
                     );
    }
    else {
      bVar1 = compile(this,(char *)0x0,(char *)0x0,local_28._M_impl.super__Vector_impl_data._M_start
                     );
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to read shader from stream");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  return bVar1;
}

Assistant:

bool Shader::loadFromStream(InputStream& stream, Type type)
{
    // Read the shader code from the stream
    std::vector<char> shader;
    if (!getStreamContents(stream, shader))
    {
        err() << "Failed to read shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    if (type == Vertex)
        return compile(&shader[0], NULL, NULL);
    else if (type == Geometry)
        return compile(NULL, &shader[0], NULL);
    else
        return compile(NULL, NULL, &shader[0]);
}